

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

bool __thiscall QPDFObjectHandle::getValueAsString(QPDFObjectHandle *this,string *value)

{
  bool bVar1;
  string sStack_38;
  
  bVar1 = isString(this);
  if (bVar1) {
    QPDFObject::getStringValue_abi_cxx11_
              (&sStack_38,
               (this->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::operator=((string *)value,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return bVar1;
}

Assistant:

bool
QPDFObjectHandle::getValueAsString(std::string& value) const
{
    if (!isString()) {
        return false;
    }
    value = obj->getStringValue();
    return true;
}